

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_wavelength_boundary.unit.cpp
# Opt level: O0

void __thiscall
TestCreateWavelengthBoundary_TestCreateWavelengthBoundary_Wavelength_Set_Test::TestBody
          (TestCreateWavelengthBoundary_TestCreateWavelengthBoundary_Wavelength_Set_Test *this)

{
  bool bVar1;
  char *message;
  Wavelength_Boundary WVar2;
  AssertHelper local_88;
  Message local_80;
  Wavelength_Boundary_Type local_74;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  Wavelength_Boundary boundary;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string line;
  ScopedTrace gtest_trace_31;
  TestCreateWavelengthBoundary_TestCreateWavelengthBoundary_Wavelength_Set_Test *this_local;
  
  testing::ScopedTrace::ScopedTrace
            ((ScopedTrace *)(line.field_2._M_local_buf + 0xf),
             "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/create_wavelength_boundary.unit.cpp"
             ,0x1f,"Begin Test: Create Wavelength Boundary Wavelength Set.");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"Wavelength set",&local_39);
  std::allocator<char>::~allocator(&local_39);
  WVar2 = window_standards::create_wavelength_boundary((string *)local_38);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = WVar2.type;
  local_74 = WAVELENGTH_SET;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Boundary_Type,_window_standards::Wavelength_Boundary_Type,_nullptr>
            ((EqHelper *)local_70,"boundary.type","Wavelength_Boundary_Type::WAVELENGTH_SET",
             (Wavelength_Boundary_Type *)&gtest_ar.message_,&local_74);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/create_wavelength_boundary.unit.cpp"
               ,0x24,message);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  std::__cxx11::string::~string((string *)local_38);
  testing::ScopedTrace::~ScopedTrace((ScopedTrace *)(line.field_2._M_local_buf + 0xf));
  return;
}

Assistant:

TEST_F(TestCreateWavelengthBoundary, TestCreateWavelengthBoundary_Wavelength_Set) {
	SCOPED_TRACE("Begin Test: Create Wavelength Boundary Wavelength Set.");

	std::string line = "Wavelength set";

	Wavelength_Boundary boundary = create_wavelength_boundary(line);
	EXPECT_EQ(boundary.type, Wavelength_Boundary_Type::WAVELENGTH_SET);

}